

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallPtrSet.cpp
# Opt level: O1

void __thiscall
llvm::SmallPtrSetImplBase::CopyFrom(SmallPtrSetImplBase *this,SmallPtrSetImplBase *RHS)

{
  void **__ptr;
  void **ppvVar1;
  uint *puVar2;
  size_t __size;
  
  if (RHS == this) {
    __assert_fail("&RHS != this && \"Self-copy should be handled by the caller.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/SmallPtrSet.cpp"
                  ,0x92,"void llvm::SmallPtrSetImplBase::CopyFrom(const SmallPtrSetImplBase &)");
  }
  ppvVar1 = this->SmallArray;
  __ptr = this->CurArray;
  if (((__ptr == ppvVar1) && (RHS->CurArray == RHS->SmallArray)) &&
     (this->CurArraySize != RHS->CurArraySize)) {
    __assert_fail("CurArraySize == RHS.CurArraySize && \"Cannot assign sets with different small sizes\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/SmallPtrSet.cpp"
                  ,0x96,"void llvm::SmallPtrSetImplBase::CopyFrom(const SmallPtrSetImplBase &)");
  }
  if (RHS->CurArray == RHS->SmallArray) {
    if (__ptr != ppvVar1) {
      free(__ptr);
    }
    ppvVar1 = this->SmallArray;
  }
  else {
    if (this->CurArraySize == RHS->CurArraySize) goto LAB_001630ea;
    __size = (ulong)RHS->CurArraySize << 3;
    if (__ptr == ppvVar1) {
      ppvVar1 = (void **)malloc(__size);
    }
    else {
      ppvVar1 = (void **)realloc(__ptr,__size);
    }
    if (ppvVar1 == (void **)0x0) {
      report_bad_alloc_error("Allocation failed",true);
    }
  }
  this->CurArray = ppvVar1;
LAB_001630ea:
  this->CurArraySize = RHS->CurArraySize;
  puVar2 = &RHS->CurArraySize;
  if (RHS->CurArray == RHS->SmallArray) {
    puVar2 = &RHS->NumNonEmpty;
  }
  if (*puVar2 != 0) {
    memmove(this->CurArray,RHS->CurArray,(ulong)*puVar2 << 3);
  }
  this->NumNonEmpty = RHS->NumNonEmpty;
  this->NumTombstones = RHS->NumTombstones;
  return;
}

Assistant:

void SmallPtrSetImplBase::CopyFrom(const SmallPtrSetImplBase &RHS) {
  assert(&RHS != this && "Self-copy should be handled by the caller.");

  if (isSmall() && RHS.isSmall())
    assert(CurArraySize == RHS.CurArraySize &&
           "Cannot assign sets with different small sizes");

  // If we're becoming small, prepare to insert into our stack space
  if (RHS.isSmall()) {
    if (!isSmall())
      free(CurArray);
    CurArray = SmallArray;
  // Otherwise, allocate new heap space (unless we were the same size)
  } else if (CurArraySize != RHS.CurArraySize) {
    if (isSmall())
      CurArray = (const void**)safe_malloc(sizeof(void*) * RHS.CurArraySize);
    else {
      const void **T = (const void**)safe_realloc(CurArray,
                                             sizeof(void*) * RHS.CurArraySize);
      CurArray = T;
    }
  }

  CopyHelper(RHS);
}